

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O2

void __thiscall ConvertorPCM2WAV::write_chunk(ConvertorPCM2WAV *this,string *name,PBuffer *data)

{
  MutableBuffer *this_00;
  __shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  MutableBuffer::push((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,name);
  MutableBuffer::push<unsigned_int>
            ((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (uint)((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size,1);
  this_00 = (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>);
  MutableBuffer::push(this_00,(PBuffer *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

void
ConvertorPCM2WAV::write_chunk(const std::string &name, PBuffer data) {
  result->push(name);
  result->push<uint32_t>(static_cast<uint32_t>(data->get_size()));
  result->push(data);
}